

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
CompileRun(JsValueRef scriptVal,JsSourceContext sourceContext,JsValueRef sourceUrl,
          JsParseScriptAttributes parseAttributes,JsValueRef *result,bool parseOnly)

{
  anon_class_48_6_2009d855 fn;
  bool bVar1;
  uint uVar2;
  JsErrorCode JVar3;
  LoadScriptFlag loadScriptFlag;
  WCHAR **in_stack_ffffffffffffff68;
  JsValueRef local_60;
  JsValueRef sourceUrl_local;
  WCHAR *url;
  byte *script;
  size_t cb;
  JsValueRef scriptVal_local;
  bool isString;
  
  JVar3 = JsErrorNullArgument;
  if (sourceUrl != (JsValueRef)0x0 && scriptVal != (JsValueRef)0x0) {
    local_60 = sourceUrl;
    cb = (size_t)scriptVal;
    bVar1 = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    scriptVal_local._7_1_ = 0;
    if (bVar1) {
      url = (WCHAR *)(**(code **)(*(long *)cb + 0x390))();
      uVar2 = (**(code **)(*(long *)cb + 0x388))();
      script = (byte *)(ulong)uVar2;
      loadScriptFlag =
           ((parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded) ==
            JsParseScriptAttributeNone | 4) << 6;
    }
    else {
      scriptVal_local._7_1_ = Js::VarIs<Js::JavascriptString>((Var)cb);
      loadScriptFlag = LoadScriptFlag_None;
      if (!(bool)scriptVal_local._7_1_) {
        return JsErrorInvalidArgument;
      }
    }
    fn.scriptVal._0_1_ = (char)&url;
    fn.isString = (bool *)&cb;
    fn.scriptVal._1_7_ = (int7)((ulong)&url >> 8);
    fn.script._0_4_ = (int)&script;
    fn.script._4_4_ = (int)((ulong)&script >> 0x20);
    fn.cb._0_1_ = (char)&local_60;
    fn.cb._1_7_ = (int7)((ulong)&local_60 >> 8);
    fn.sourceUrl = &sourceUrl_local;
    fn.url = in_stack_ffffffffffffff68;
    JVar3 = GlobalAPIWrapper_NoRecord<CompileRun(void*,unsigned_long,void*,_JsParseScriptAttributes,void**,bool)::__0>
                      (fn);
    if (JVar3 == JsNoError) {
      JVar3 = RunScriptCore((JsValueRef)cb,(byte *)url,(size_t)script,loadScriptFlag,sourceContext,
                            (WCHAR *)sourceUrl_local,parseOnly,parseAttributes,false,result);
    }
  }
  return JVar3;
}

Assistant:

_ALWAYSINLINE JsErrorCode CompileRun(
    JsValueRef scriptVal,
    JsSourceContext sourceContext,
    JsValueRef sourceUrl,
    JsParseScriptAttributes parseAttributes,
    _Out_ JsValueRef *result,
    bool parseOnly)
{
    PARAM_NOT_NULL(scriptVal);
    VALIDATE_JSREF(scriptVal);
    PARAM_NOT_NULL(sourceUrl);

    bool isExternalArray = Js::VarIs<Js::ArrayBuffer>(scriptVal),
        isString = false;
    bool isUtf8 = !(parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded);

    LoadScriptFlag scriptFlag = LoadScriptFlag_None;
    const byte* script;
    size_t cb;
    const WCHAR *url;

    if (isExternalArray)
    {
        script = ((Js::ExternalArrayBuffer*)(scriptVal))->GetBuffer();

        cb = ((Js::ExternalArrayBuffer*)(scriptVal))->GetByteLength();

        scriptFlag = (LoadScriptFlag)(isUtf8 ?
            LoadScriptFlag_ExternalArrayBuffer | LoadScriptFlag_Utf8Source :
            LoadScriptFlag_ExternalArrayBuffer);
    }
    else
    {
        isString = Js::VarIs<Js::JavascriptString>(scriptVal);
        if (!isString)
        {
            return JsErrorInvalidArgument;
        }
    }

    JsErrorCode error = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        if (isString)
        {
            Js::JavascriptString* jsString = Js::VarTo<Js::JavascriptString>(scriptVal);
            script = (const byte*)jsString->GetSz();

            // JavascriptString is 2 bytes (WCHAR/char16)
            cb = jsString->GetLength() * sizeof(WCHAR);
        }

        if (!Js::VarIs<Js::JavascriptString>(sourceUrl))
        {
            return JsErrorInvalidArgument;
        }

        url = Js::VarTo<Js::JavascriptString>(sourceUrl)->GetSz();

        return JsNoError;

    });

    if (error != JsNoError)
    {
        return error;
    }

    return RunScriptCore(scriptVal, script, cb, scriptFlag,
        sourceContext, url, parseOnly, parseAttributes, false, result);
}